

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

Option * __thiscall
CLI::App::set_version_flag
          (App *this,string *flag_name,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *vfunc,string *version_help)

{
  Option *pOVar1;
  string local_a0;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  local_80;
  function<void_()> local_60;
  string local_40;
  
  if (this->version_ptr_ != (Option *)0x0) {
    remove_option(this,this->version_ptr_);
    this->version_ptr_ = (Option *)0x0;
  }
  if (flag_name->_M_string_length == 0) {
    pOVar1 = (Option *)0x0;
  }
  else {
    ::std::__cxx11::string::string((string *)&local_40,(string *)flag_name);
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    function(&local_80,vfunc);
    ::std::function<void()>::
    function<CLI::App::set_version_flag(std::__cxx11::string,std::function<std::__cxx11::string()>,std::__cxx11::string_const&)::_lambda()_1_,void>
              ((function<void()> *)&local_60,(anon_class_32_1_a8c8e75a *)&local_80);
    ::std::__cxx11::string::string((string *)&local_a0,(string *)version_help);
    pOVar1 = add_flag_callback(this,&local_40,&local_60,&local_a0);
    this->version_ptr_ = pOVar1;
    ::std::__cxx11::string::~string((string *)&local_a0);
    std::_Function_base::~_Function_base(&local_60.super__Function_base);
    std::_Function_base::~_Function_base(&local_80.super__Function_base);
    ::std::__cxx11::string::~string((string *)&local_40);
    pOVar1 = this->version_ptr_;
    (pOVar1->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *
App::set_version_flag(std::string flag_name, std::function<std::string()> vfunc, const std::string &version_help) {
    if(version_ptr_ != nullptr) {
        remove_option(version_ptr_);
        version_ptr_ = nullptr;
    }

    // Empty name will simply remove the version flag
    if(!flag_name.empty()) {
        version_ptr_ =
            add_flag_callback(flag_name, [vfunc]() { throw(CLI::CallForVersion(vfunc(), 0)); }, version_help);
        version_ptr_->configurable(false);
    }

    return version_ptr_;
}